

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_map_key_type key;
  nghttp2_on_frame_recv_callback p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  nghttp2_stream *stream;
  char *reason;
  
  key = (frame->hd).stream_id;
  if (key == 0) {
    reason = "RST_STREAM: stream_id == 0";
  }
  else {
    if (key <= (&session->last_sent_stream_id)[(byte)(session->server == '\0' ^ (byte)key) & 1]) {
      stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,key);
      if ((stream == (nghttp2_stream *)0x0) || ((stream->flags & 2) != 0)) {
        stream = (nghttp2_stream *)0x0;
      }
      else if (stream->state == NGHTTP2_STREAM_IDLE) {
        stream = (nghttp2_stream *)0x0;
      }
      if (stream != (nghttp2_stream *)0x0) {
        nghttp2_stream_shutdown(stream,NGHTTP2_SHUT_RD);
      }
      p_Var1 = (session->callbacks).on_frame_recv_callback;
      if ((p_Var1 == (nghttp2_on_frame_recv_callback)0x0) ||
         (iVar3 = (*p_Var1)(session,frame,session->user_data), iVar3 == 0)) {
        iVar3 = 0;
        bVar2 = true;
      }
      else {
        iVar3 = -0x386;
        bVar2 = false;
      }
      if (bVar2) {
        iVar4 = nghttp2_session_close_stream
                          (session,(frame->hd).stream_id,(frame->rst_stream).error_code);
        iVar3 = 0;
        if (iVar4 < -900) {
          iVar3 = iVar4;
        }
      }
      return iVar3;
    }
    reason = "RST_STREAM: stream in idle";
  }
  iVar3 = session_handle_invalid_connection(session,frame,-0x1f9,reason);
  return iVar3;
}

Assistant:

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,
                                           nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  if (frame->hd.stream_id == 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream_id == 0");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream in idle");
  }

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (stream) {
    /* We may use stream->shut_flags for strict error checking. */
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
  }

  rv = session_call_on_frame_received(session, frame);
  if (rv != 0) {
    return rv;
  }
  rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                    frame->rst_stream.error_code);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return 0;
}